

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int select_next_protocol(uchar **out,uchar *outlen,uchar *in,uint inlen,char *key,uint keylen)

{
  int iVar1;
  uint local_40;
  uint i;
  uint keylen_local;
  char *key_local;
  uint inlen_local;
  uchar *in_local;
  uchar *outlen_local;
  uchar **out_local;
  
  local_40 = 0;
  while( true ) {
    if (inlen < local_40 + keylen) {
      return -1;
    }
    iVar1 = memcmp(in + (local_40 + 1),key,(ulong)keylen);
    if (iVar1 == 0) break;
    local_40 = in[local_40] + 1 + local_40;
  }
  *out = in + (local_40 + 1);
  *outlen = in[local_40];
  return 0;
}

Assistant:

static int
select_next_protocol(unsigned char **out, unsigned char *outlen,
                     const unsigned char *in, unsigned int inlen,
                     const char *key, unsigned int keylen)
{
  unsigned int i;
  for(i = 0; i + keylen <= inlen; i += in[i] + 1) {
    if(memcmp(&in[i + 1], key, keylen) == 0) {
      *out = (unsigned char *) &in[i + 1];
      *outlen = in[i];
      return 0;
    }
  }
  return -1;
}